

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int compute_num_enc_workers(AV1_COMP *cpi,int max_workers)

{
  int in_ESI;
  long in_RDI;
  int in_stack_0000001c;
  AV1_COMMON *in_stack_00000020;
  undefined4 local_4;
  
  if (in_ESI < 2) {
    local_4 = 1;
  }
  else if ((*(byte *)(in_RDI + 0x42771) & 1) == 0) {
    local_4 = compute_num_enc_tile_mt_workers((AV1_COMMON *)(in_RDI + 0x3bf80),in_ESI);
  }
  else {
    local_4 = compute_num_enc_row_mt_workers(in_stack_00000020,in_stack_0000001c);
  }
  return local_4;
}

Assistant:

static int compute_num_enc_workers(const AV1_COMP *cpi, int max_workers) {
  if (max_workers <= 1) return 1;
  if (cpi->oxcf.row_mt)
    return compute_num_enc_row_mt_workers(&cpi->common, max_workers);
  else
    return compute_num_enc_tile_mt_workers(&cpi->common, max_workers);
}